

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O0

void __thiscall
TypedObjectPool<detail::node<NULLC::Range>,_1024>::Deallocate
          (TypedObjectPool<detail::node<NULLC::Range>,_1024> *this,node<NULLC::Range> *ptr)

{
  MySmallBlock *freedBlock;
  node<NULLC::Range> *ptr_local;
  TypedObjectPool<detail::node<NULLC::Range>,_1024> *this_local;
  
  if (ptr != (node<NULLC::Range> *)0x0) {
    (ptr->key).start = this->freeBlocks;
    this->freeBlocks = (MySmallBlock *)ptr;
  }
  return;
}

Assistant:

void Deallocate(T* ptr)
	{
		if(!ptr)
			return;

		MySmallBlock *freedBlock = (MySmallBlock*)(void*)ptr;
		ptr->~T();	// Destroy object

		freedBlock->next = freeBlocks;
		freeBlocks = freedBlock;
	}